

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

AWeapon * __thiscall APlayerPawn::PickNewWeapon(APlayerPawn *this,PClassAmmo *ammotype)

{
  AWeapon *pAVar1;
  AWeapon *best;
  PClassAmmo *ammotype_local;
  APlayerPawn *this_local;
  
  pAVar1 = BestWeapon(this,ammotype);
  if (pAVar1 != (AWeapon *)0x0) {
    ((this->super_AActor).player)->PendingWeapon = pAVar1;
    if (((this->super_AActor).player)->ReadyWeapon == (AWeapon *)0x0) {
      if (((this->super_AActor).player)->PendingWeapon !=
          (AWeapon *)AWeapon::RegistrationInfo.MyClass) {
        P_BringUpWeapon((this->super_AActor).player);
      }
    }
    else {
      P_DropWeapon((this->super_AActor).player);
    }
  }
  return pAVar1;
}

Assistant:

AWeapon *APlayerPawn::PickNewWeapon(PClassAmmo *ammotype)
{
	AWeapon *best = BestWeapon (ammotype);

	if (best != NULL)
	{
		player->PendingWeapon = best;
		if (player->ReadyWeapon != NULL)
		{
			P_DropWeapon(player);
		}
		else if (player->PendingWeapon != WP_NOCHANGE)
		{
			P_BringUpWeapon (player);
		}
	}
	return best;
}